

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O3

int idaLsJacTimesSetupBS
              (sunrealtype tt,N_Vector yyB,N_Vector ypB,N_Vector rrB,sunrealtype c_jB,void *ida_mem)

{
  IDAadjMem pIVar1;
  int iVar2;
  N_Vector *pp_Var3;
  N_Vector *pp_Var4;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  
  IDA_mem = (IDAMem)0x0;
  IDAADJ_mem = (IDAadjMem)0x0;
  idalsB_mem = (IDALsMemB)0x0;
  IDAB_mem = (IDABMem)0x0;
  idaLs_AccessLMemBCur(ida_mem,"idaLsJacTimesSetupBS",&IDA_mem,&IDAADJ_mem,&IDAB_mem,&idalsB_mem);
  pIVar1 = IDAADJ_mem;
  if (IDAADJ_mem->ia_noInterp == 0) {
    if (IDAADJ_mem->ia_interpSensi == 0) {
      pp_Var3 = (N_Vector *)0x0;
      pp_Var4 = (N_Vector *)0x0;
    }
    else {
      pp_Var3 = IDAADJ_mem->ia_yySTmp;
      pp_Var4 = IDAADJ_mem->ia_ypSTmp;
    }
    iVar2 = (*IDAADJ_mem->ia_getY)
                      (IDA_mem,tt,IDAADJ_mem->ia_yyTmp,IDAADJ_mem->ia_ypTmp,pp_Var3,pp_Var4);
    if (iVar2 != 0) {
      IDAProcessError(IDAB_mem->IDA_mem,-1,0x9d4,"idaLsJacTimesSetupBS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                      ,"Bad t for interpolation.");
      return -1;
    }
  }
  iVar2 = (*idalsB_mem->jtsetupBS)
                    (tt,pIVar1->ia_yyTmp,pIVar1->ia_ypTmp,pIVar1->ia_yySTmp,pIVar1->ia_ypSTmp,yyB,
                     ypB,rrB,c_jB,IDAB_mem->ida_user_data);
  return iVar2;
}

Assistant:

static int idaLsJacTimesSetupBS(sunrealtype tt, N_Vector yyB, N_Vector ypB,
                                N_Vector rrB, sunrealtype c_jB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDALsMemB idalsB_mem;
  IDABMem IDAB_mem;
  int retval;

  /* access relevant memory structures */
  IDA_mem    = NULL;
  IDAADJ_mem = NULL;
  idalsB_mem = NULL;
  IDAB_mem   = NULL;
  retval     = idaLs_AccessLMemBCur(ida_mem, __func__, &IDA_mem, &IDAADJ_mem,
                                    &IDAB_mem, &idalsB_mem);

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    if (IDAADJ_mem->ia_interpSensi)
    {
      retval = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                   IDAADJ_mem->ia_ypTmp, IDAADJ_mem->ia_yySTmp,
                                   IDAADJ_mem->ia_ypSTmp);
    }
    else
    {
      retval = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                   IDAADJ_mem->ia_ypTmp, NULL, NULL);
    }
    if (retval != IDA_SUCCESS)
    {
      IDAProcessError(IDAB_mem->IDA_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_T);
      return (-1);
    }
  }

  /* Call user's adjoint jtimesBS routine */
  return (idalsB_mem->jtsetupBS(tt, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                                IDAADJ_mem->ia_yySTmp, IDAADJ_mem->ia_ypSTmp,
                                yyB, ypB, rrB, c_jB, IDAB_mem->ida_user_data));
}